

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::SecretManager::BindCreateSecret
          (BoundStatement *__return_storage_ptr__,SecretManager *this,CatalogTransaction transaction
          ,CreateSecretInput *info)

{
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var1;
  BoundStatement *pBVar2;
  undefined8 uVar3;
  bool bVar4;
  CreateSecretFunction *pCVar5;
  iterator iVar6;
  mapped_type *this_00;
  BinderException *pBVar7;
  char *pcVar8;
  __node_base *p_Var9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_2f1;
  BoundStatement *local_2f0;
  string error_msg;
  optional_ptr<duckdb::CreateSecretFunction,_true> function;
  Value cast_value;
  string provider;
  string type;
  string local_240;
  string default_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  LogicalType local_120;
  CreateSecretInput bound_info;
  
  local_2f0 = __return_storage_ptr__;
  InitializeSecrets(this,transaction);
  ::std::__cxx11::string::string((string *)&type,(string *)info);
  ::std::__cxx11::string::string((string *)&provider,(string *)&info->provider);
  if (provider._M_string_length == 0) {
    LookupTypeInternal((SecretType *)&bound_info,this,&type);
    ::std::__cxx11::string::_M_assign((string *)&provider);
    SecretType::~SecretType((SecretType *)&bound_info);
    pcVar8 = "default ";
  }
  else {
    pcVar8 = anon_var_dwarf_3b2a81b + 9;
  }
  ::std::__cxx11::string::string((string *)&default_string,pcVar8,(allocator *)&bound_info);
  function = LookupFunctionInternal(this,&type,&provider);
  if (function.ptr != (CreateSecretFunction *)0x0) {
    CreateSecretInput::CreateSecretInput(&bound_info,info);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&bound_info.options._M_h);
    p_Var9 = &(info->options)._M_h._M_before_begin;
    while( true ) {
      p_Var9 = p_Var9->_M_nxt;
      if (p_Var9 == (__node_base *)0x0) {
        (local_2f0->names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2f0->names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2f0->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2f0->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_2f0->plan).
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
             (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
        (local_2f0->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2f0->names).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::__cxx11::string::string((string *)&cast_value,"Success",(allocator *)&local_240);
        __l._M_len = 1;
        __l._M_array = (iterator)&cast_value;
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&error_msg,__l,&local_2f1);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_2f0->names,&error_msg);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&error_msg);
        ::std::__cxx11::string::~string((string *)&cast_value);
        LogicalType::LogicalType((LogicalType *)&error_msg,BOOLEAN);
        __l_00._M_len = 1;
        __l_00._M_array = (iterator)&error_msg;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&cast_value,
                   __l_00,(allocator_type *)&local_240);
        pBVar2 = local_2f0;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_move_assign
                  (&(local_2f0->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                   &cast_value);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&cast_value)
        ;
        LogicalType::~LogicalType((LogicalType *)&error_msg);
        make_uniq<duckdb::LogicalCreateSecret,duckdb::CreateSecretInput>
                  ((duckdb *)&cast_value,&bound_info);
        uVar3 = cast_value.type_._0_8_;
        cast_value.type_.id_ = INVALID;
        cast_value.type_.physical_type_ = ~INVALID;
        cast_value.type_._2_6_ = 0;
        _Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (pBVar2->plan).
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
        (pBVar2->plan).
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
             (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)uVar3;
        if (_Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
            (LogicalOperator *)0x0) {
          (**(code **)(*(long *)_Var1.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                _M_head_impl + 8))();
          if (cast_value.type_._0_8_ != 0) {
            (**(code **)(*(long *)cast_value.type_._0_8_ + 8))();
          }
        }
        CreateSecretInput::~CreateSecretInput(&bound_info);
        ::std::__cxx11::string::~string((string *)&default_string);
        ::std::__cxx11::string::~string((string *)&provider);
        ::std::__cxx11::string::~string((string *)&type);
        return local_2f0;
      }
      pCVar5 = optional_ptr<duckdb::CreateSecretFunction,_true>::operator->(&function);
      iVar6 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(pCVar5->named_parameters)._M_h,(key_type *)(p_Var9 + 1));
      optional_ptr<duckdb::CreateSecretFunction,_true>::operator->(&function);
      if (iVar6.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          ._M_cur == (__node_type *)0x0) break;
      error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
      error_msg._M_string_length = 0;
      error_msg.field_2._M_local_buf[0] = '\0';
      LogicalType::LogicalType(&local_120,SQLNULL);
      Value::Value(&cast_value,&local_120);
      LogicalType::~LogicalType(&local_120);
      bVar4 = Value::DefaultTryCastAs
                        ((Value *)(p_Var9 + 5),
                         (LogicalType *)
                         ((long)iVar6.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                ._M_cur + 0x28),&cast_value,&error_msg,false);
      if (!bVar4) {
        pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_240,"Failed to cast option \'%s\' to type \'%s\': \'%s\'",
                   (allocator *)&local_2f1);
        ::std::__cxx11::string::string
                  ((string *)&local_1c0,
                   (string *)
                   ((long)iVar6.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                          ._M_cur + 8));
        LogicalType::ToString_abi_cxx11_
                  (&local_1e0,
                   (LogicalType *)
                   ((long)iVar6.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                          ._M_cur + 0x28));
        ::std::__cxx11::string::string((string *)&local_200,(string *)&error_msg);
        BinderException::
        BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (pBVar7,&local_240,&local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0,
                   &local_200);
        __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      this_00 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&bound_info.options,
                             (key_type *)
                             ((long)iVar6.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                    ._M_cur + 8));
      Value::operator=(this_00,&cast_value);
      Value::~Value(&cast_value);
      ::std::__cxx11::string::~string((string *)&error_msg);
    }
    pBVar7 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&cast_value,
               "Unknown parameter \'%s\' for secret type \'%s\' with %sprovider \'%s\'",
               (allocator *)&error_msg);
    ::std::__cxx11::string::string((string *)&local_140,(string *)(p_Var9 + 1));
    ::std::__cxx11::string::string((string *)&local_160,(string *)&type);
    ::std::__cxx11::string::string((string *)&local_180,(string *)&default_string);
    ::std::__cxx11::string::string((string *)&local_1a0,(string *)&provider);
    BinderException::
    BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (pBVar7,(string *)&cast_value,&local_140,&local_160,&local_180,&local_1a0);
    __cxa_throw(pBVar7,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ThrowProviderNotFoundError(this,&info->type,&info->provider,provider._M_string_length == 0);
}

Assistant:

BoundStatement SecretManager::BindCreateSecret(CatalogTransaction transaction, CreateSecretInput &info) {
	InitializeSecrets(transaction);

	auto type = info.type;
	auto provider = info.provider;
	bool default_provider = false;

	if (provider.empty()) {
		default_provider = true;
		auto secret_type = LookupTypeInternal(type);
		provider = secret_type.default_provider;
	}

	string default_string = default_provider ? "default " : "";

	auto function = LookupFunctionInternal(type, provider);

	if (!function) {
		ThrowProviderNotFoundError(info.type, info.provider, default_provider);
	}

	auto bound_info = info;
	bound_info.options.clear();

	// We cast the passed parameters
	for (const auto &param : info.options) {
		auto matched_param = function->named_parameters.find(param.first);
		if (matched_param == function->named_parameters.end()) {
			throw BinderException("Unknown parameter '%s' for secret type '%s' with %sprovider '%s'", param.first, type,
			                      default_string, provider);
		}

		// Cast the provided value to the expected type
		string error_msg;
		Value cast_value;
		if (!param.second.DefaultTryCastAs(matched_param->second, cast_value, &error_msg)) {
			throw BinderException("Failed to cast option '%s' to type '%s': '%s'", matched_param->first,
			                      matched_param->second.ToString(), error_msg);
		}

		bound_info.options[matched_param->first] = {cast_value};
	}

	BoundStatement result;
	result.names = {"Success"};
	result.types = {LogicalType::BOOLEAN};
	result.plan = make_uniq<LogicalCreateSecret>(std::move(bound_info));
	return result;
}